

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool __thiscall Preprocessor::skipBranch(Preprocessor *this)

{
  Token TVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = (this->super_Parser).symbols.d.size;
  lVar2 = (this->super_Parser).index;
  if (lVar2 < lVar3 + -1) {
    do {
      TVar1 = (this->super_Parser).symbols.d.ptr[lVar2].token;
      bVar4 = TVar1 - PP_ELIF < 3;
      if (bVar4) {
        return bVar4;
      }
      if (TVar1 - PP_IF < 3) {
        (this->super_Parser).index = lVar2 + 1;
        skipUntilEndif(this);
        lVar3 = (this->super_Parser).symbols.d.size;
        lVar2 = (this->super_Parser).index;
      }
      lVar2 = lVar2 + 1;
      (this->super_Parser).index = lVar2;
    } while (lVar2 < lVar3 + -1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }